

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O2

void __thiscall Clone_componentWithResets_Test::TestBody(Clone_componentWithResets_Test *this)

{
  string *psVar1;
  ComponentPtr c;
  ComponentPtr cClone;
  ResetPtr r2;
  ResetPtr r1;
  string *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  string local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50 [3];
  undefined8 local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  libcellml::Component::create();
  libcellml::Reset::create();
  libcellml::Reset::create();
  psVar1 = local_68;
  std::__cxx11::string::string<std::allocator<char>>(local_58,"unique",(allocator<char> *)&local_38)
  ;
  libcellml::Entity::setId(psVar1);
  std::__cxx11::string::~string(local_58);
  psVar1 = local_68;
  std::__cxx11::string::string<std::allocator<char>>(local_58,"copy",(allocator<char> *)&local_38);
  libcellml::NamedEntity::setName(psVar1);
  std::__cxx11::string::~string(local_58);
  libcellml::Component::addReset((shared_ptr *)local_68);
  libcellml::Component::addReset((shared_ptr *)local_68);
  libcellml::Component::clone();
  local_38 = 0;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  compareComponent((shared_ptr *)&local_68,(shared_ptr *)local_58,(shared_ptr *)&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_10);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  return;
}

Assistant:

TEST(Clone, componentWithResets)
{
    auto c = libcellml::Component::create();
    auto r1 = libcellml::Reset::create();
    auto r2 = libcellml::Reset::create();

    c->setId("unique");
    c->setName("copy");

    c->addReset(r1);
    c->addReset(r2);

    auto cClone = c->clone();

    compareComponent(c, cClone);
}